

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ChainstateManager::GenerateCoinbaseCommitment
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ChainstateManager *this,CBlock *block,CBlockIndex *pindexPrev)

{
  pointer psVar1;
  element_type *peVar2;
  pointer pCVar3;
  char *pcVar4;
  pointer puVar5;
  pointer puVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  CTransaction *pCVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  size_type sVar9;
  size_type *psVar10;
  uchar *data;
  undefined8 uVar11;
  uchar *puVar12;
  long lVar13;
  ulong uVar14;
  undefined8 __first;
  ulong uVar15;
  long in_FS_OFFSET;
  bool bVar16;
  Span<unsigned_char> output;
  CMutableTransaction tx;
  uint256 witnessroot;
  CTransaction *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  undefined1 local_f1;
  CTxOut local_f0;
  undefined1 auStack_c8 [8];
  pointer pCStack_c0;
  pointer pCStack_b8;
  vector<CTxOut,_std::allocator<CTxOut>_> vStack_b0;
  uchar local_98 [64];
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar1 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar16 = true;
  if (psVar1 != (block->vtx).
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    peVar2 = (psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pCVar3 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar13 = (long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pCVar3;
    if (lVar13 != 0) {
      lVar13 = (lVar13 >> 3) * -0x3333333333333333;
      psVar10 = (size_type *)((long)&pCVar3->scriptPubKey + 0x1c);
      uVar14 = 0xffffffff;
      uVar15 = 0;
      do {
        if (((((0x42 < *psVar10) &&
              (pcVar4 = *(char **)&((CScriptBase *)(psVar10 + -7))->_union, *pcVar4 == 'j')) &&
             (pcVar4[1] == '$')) && ((pcVar4[2] == -0x56 && (pcVar4[3] == '!')))) &&
           ((pcVar4[4] == -0x57 && (pcVar4[5] == -0x13)))) {
          uVar14 = uVar15 & 0xffffffff;
        }
        uVar15 = uVar15 + 1;
        psVar10 = psVar10 + 10;
      } while (lVar13 + (ulong)(lVar13 == 0) != uVar15);
      bVar16 = (int)uVar14 == -1;
    }
  }
  data = (uchar *)operator_new(0x20);
  data[0] = '\0';
  data[1] = '\0';
  data[2] = '\0';
  data[3] = '\0';
  data[4] = '\0';
  data[5] = '\0';
  data[6] = '\0';
  data[7] = '\0';
  data[8] = '\0';
  data[9] = '\0';
  data[10] = '\0';
  data[0xb] = '\0';
  data[0xc] = '\0';
  data[0xd] = '\0';
  data[0xe] = '\0';
  data[0xf] = '\0';
  data[0x10] = '\0';
  data[0x11] = '\0';
  data[0x12] = '\0';
  data[0x13] = '\0';
  data[0x14] = '\0';
  data[0x15] = '\0';
  data[0x16] = '\0';
  data[0x17] = '\0';
  data[0x18] = '\0';
  data[0x19] = '\0';
  data[0x1a] = '\0';
  data[0x1b] = '\0';
  data[0x1c] = '\0';
  data[0x1d] = '\0';
  data[0x1e] = '\0';
  data[0x1f] = '\0';
  if (bVar16) {
    BlockWitnessMerkleRoot(&local_58,block,(bool *)0x0);
    local_98[0x20] = '\0';
    local_98[0x21] = '\0';
    local_98[0x22] = '\0';
    local_98[0x23] = '\0';
    local_98[0x24] = '\0';
    local_98[0x25] = '\0';
    local_98[0x26] = '\0';
    local_98[0x27] = '\0';
    local_98[0x28] = '\0';
    local_98[0x29] = '\0';
    local_98[0x2a] = '\0';
    local_98[0x2b] = '\0';
    local_98[0x2c] = '\0';
    local_98[0x2d] = '\0';
    local_98[0x2e] = '\0';
    local_98[0x2f] = '\0';
    local_98[0x10] = '\0';
    local_98[0x11] = '\0';
    local_98[0x12] = '\0';
    local_98[0x13] = '\0';
    local_98[0x14] = '\0';
    local_98[0x15] = '\0';
    local_98[0x16] = '\0';
    local_98[0x17] = '\0';
    local_98[0x18] = '\0';
    local_98[0x19] = '\0';
    local_98[0x1a] = '\0';
    local_98[0x1b] = '\0';
    local_98[0x1c] = '\0';
    local_98[0x1d] = '\0';
    local_98[0x1e] = '\0';
    local_98[0x1f] = '\0';
    local_98[0] = '\0';
    local_98[1] = '\0';
    local_98[2] = '\0';
    local_98[3] = '\0';
    local_98[4] = '\0';
    local_98[5] = '\0';
    local_98[6] = '\0';
    local_98[7] = '\0';
    local_98[8] = '\0';
    local_98[9] = '\0';
    local_98[10] = '\0';
    local_98[0xb] = '\0';
    local_98[0xc] = '\0';
    local_98[0xd] = '\0';
    local_98[0xe] = '\0';
    local_98[0xf] = '\0';
    vStack_b0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_b0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pCStack_b8 = (pointer)0x0;
    vStack_b0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    auStack_c8 = (undefined1  [8])0x0;
    pCStack_c0 = (pointer)0x0;
    local_98[0x30] = '\0';
    local_98[0x31] = '\0';
    local_98[0x32] = '\0';
    local_98[0x33] = '\0';
    local_98[0x34] = '\0';
    local_98[0x35] = '\0';
    local_98[0x36] = '\0';
    local_98[0x37] = '\0';
    CSHA256::CSHA256((CSHA256 *)auStack_c8);
    CSHA256::Write((CSHA256 *)auStack_c8,(uchar *)&local_58,0x20);
    CSHA256::Write((CSHA256 *)auStack_c8,data,0x20);
    output.m_size = 0x20;
    output.m_data = (uchar *)&local_58;
    CHash256::Finalize((CHash256 *)auStack_c8,output);
    CTxOut::CTxOut(&local_f0);
    __first = &local_f0.scriptPubKey;
    local_f0.nValue = 0;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)__first,0x26);
    uVar11 = __first;
    if (0x1c < local_f0.scriptPubKey.super_CScriptBase._size) {
      uVar11 = local_f0.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    }
    (((CScript *)uVar11)->super_CScriptBase)._union.direct[0] = 'j';
    uVar11 = local_f0.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    if (local_f0.scriptPubKey.super_CScriptBase._size < 0x1d) {
      uVar11 = &local_f0.scriptPubKey.super_CScriptBase._union;
    }
    *(char *)(uVar11 + 1) = '$';
    uVar11 = local_f0.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    if (local_f0.scriptPubKey.super_CScriptBase._size < 0x1d) {
      uVar11 = &local_f0.scriptPubKey.super_CScriptBase._union;
    }
    *(char *)(uVar11 + 2) = -0x56;
    uVar11 = local_f0.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    if (local_f0.scriptPubKey.super_CScriptBase._size < 0x1d) {
      uVar11 = &local_f0.scriptPubKey.super_CScriptBase._union;
    }
    *(char *)(uVar11 + 3) = '!';
    uVar11 = local_f0.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    if (local_f0.scriptPubKey.super_CScriptBase._size < 0x1d) {
      uVar11 = &local_f0.scriptPubKey.super_CScriptBase._union;
    }
    *(char *)(uVar11 + 4) = -0x57;
    uVar11 = local_f0.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    if (local_f0.scriptPubKey.super_CScriptBase._size < 0x1d) {
      uVar11 = &local_f0.scriptPubKey.super_CScriptBase._union;
    }
    *(char *)(uVar11 + 5) = -0x13;
    uVar11 = local_f0.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    if (local_f0.scriptPubKey.super_CScriptBase._size < 0x1d) {
      uVar11 = &local_f0.scriptPubKey.super_CScriptBase._union;
    }
    puVar12 = (uchar *)(uVar11 + 6);
    *(undefined8 *)(puVar12 + 0x10) = local_58.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)(puVar12 + 0x18) = local_58.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)puVar12 = local_58.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)(puVar12 + 8) = local_58.super_base_blob<256U>.m_data._M_elems._8_8_;
    sVar9 = local_f0.scriptPubKey.super_CScriptBase._size;
    if (0x1c < local_f0.scriptPubKey.super_CScriptBase._size) {
      __first = local_f0.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
      sVar9 = local_f0.scriptPubKey.super_CScriptBase._size - 0x1d;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)auStack_c8,(iterator)__first,
               (uchar *)(__first + (long)(int)sVar9),(allocator_type *)&local_108);
    puVar5 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar6 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_c8;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)pCStack_c0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pCStack_b8;
    auStack_c8 = (undefined1  [8])0x0;
    pCStack_c0 = (pointer)0x0;
    pCStack_b8 = (pointer)0x0;
    if ((puVar5 != (pointer)0x0) &&
       (operator_delete(puVar5,(long)puVar6 - (long)puVar5), auStack_c8 != (undefined1  [8])0x0)) {
      operator_delete((void *)auStack_c8,(long)pCStack_b8 - (long)auStack_c8);
    }
    CMutableTransaction::CMutableTransaction
              ((CMutableTransaction *)auStack_c8,
               (((block->vtx).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back(&vStack_b0,&local_f0);
    local_108 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
              (&_Stack_100,&local_108,(allocator<CTransaction> *)&local_f1,
               (CMutableTransaction *)auStack_c8);
    _Var8._M_pi = _Stack_100._M_pi;
    pCVar7 = local_108;
    psVar1 = (block->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_108 = (CTransaction *)0x0;
    _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    (psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pCVar7;
    (psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var8._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (_Stack_100._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_100._M_pi);
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_b0);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)auStack_c8);
    if (0x1c < local_f0.scriptPubKey.super_CScriptBase._size) {
      free(local_f0.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
    }
  }
  UpdateUncommittedBlockStructures(this,block,pindexPrev);
  operator_delete(data,0x20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> ChainstateManager::GenerateCoinbaseCommitment(CBlock& block, const CBlockIndex* pindexPrev) const
{
    std::vector<unsigned char> commitment;
    int commitpos = GetWitnessCommitmentIndex(block);
    std::vector<unsigned char> ret(32, 0x00);
    if (commitpos == NO_WITNESS_COMMITMENT) {
        uint256 witnessroot = BlockWitnessMerkleRoot(block, nullptr);
        CHash256().Write(witnessroot).Write(ret).Finalize(witnessroot);
        CTxOut out;
        out.nValue = 0;
        out.scriptPubKey.resize(MINIMUM_WITNESS_COMMITMENT);
        out.scriptPubKey[0] = OP_RETURN;
        out.scriptPubKey[1] = 0x24;
        out.scriptPubKey[2] = 0xaa;
        out.scriptPubKey[3] = 0x21;
        out.scriptPubKey[4] = 0xa9;
        out.scriptPubKey[5] = 0xed;
        memcpy(&out.scriptPubKey[6], witnessroot.begin(), 32);
        commitment = std::vector<unsigned char>(out.scriptPubKey.begin(), out.scriptPubKey.end());
        CMutableTransaction tx(*block.vtx[0]);
        tx.vout.push_back(out);
        block.vtx[0] = MakeTransactionRef(std::move(tx));
    }
    UpdateUncommittedBlockStructures(block, pindexPrev);
    return commitment;
}